

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel_p.h
# Opt level: O2

void __thiscall
QSqlTableModelPrivate::ModifiedRow::ModifiedRow(ModifiedRow *this,Op o,QSqlRecord *r)

{
  this->m_op = None;
  QSqlRecord::QSqlRecord(&this->m_rec);
  QSqlRecord::QSqlRecord(&this->m_db_values,r);
  this->m_insert = o == Insert;
  setOp(this,o);
  return;
}

Assistant:

inline ModifiedRow(Op o = None, const QSqlRecord &r = QSqlRecord())
            : m_op(None), m_db_values(r), m_insert(o == Insert)
        { setOp(o); }